

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnpc-c++.c++
# Opt level: O3

StringPtr __thiscall
capnp::anon_unknown_1::CapnpcCppMain::protoName<capnp::schema::Enumerant::Reader>
          (CapnpcCppMain *this,Reader proto)

{
  ElementCount index;
  bool bVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  ArrayPtr<const_char> AVar6;
  StructReader local_e8;
  StructReader local_b8;
  ListReader local_88;
  PointerReader local_58;
  
  if (proto._reader.pointerCount < 2) {
    local_e8.pointers._0_4_ = 0x7fffffff;
    local_e8.capTable = (CapTableReader *)0x0;
    local_e8.data = (WirePointer *)0x0;
    local_e8.segment = (SegmentReader *)0x0;
  }
  else {
    local_e8.data = proto._reader.pointers + 1;
    local_e8.capTable = proto._reader.capTable;
    local_e8.segment = proto._reader.segment;
    local_e8.pointers._0_4_ = proto._reader.nestingLimit;
  }
  index = 0;
  _::PointerReader::getList(&local_88,(PointerReader *)&local_e8,INLINE_COMPOSITE,(word *)0x0);
  if (local_88.elementCount != 0) {
    do {
      _::ListReader::getStructElement(&local_e8,&local_88,index);
      if ((0x3f < local_e8.dataSize) && (*local_e8.data == (WirePointer)0xf264a779fef191ce)) {
        bVar1 = local_e8.pointerCount == 0;
        local_58.pointer = (WirePointer *)CONCAT44(local_e8.pointers._4_4_,(int)local_e8.pointers);
        if (bVar1) {
          local_58.pointer = (WirePointer *)0x0;
        }
        if (bVar1) {
          local_e8.nestingLimit = 0x7fffffff;
        }
        local_58.segment._0_4_ = 0;
        local_58.segment._4_4_ = 0;
        local_58.capTable._0_4_ = 0;
        local_58.capTable._4_4_ = 0;
        if (!bVar1) {
          local_58.segment._0_4_ = local_e8.segment._0_4_;
          local_58.segment._4_4_ = local_e8.segment._4_4_;
          local_58.capTable._0_4_ = local_e8.capTable._0_4_;
          local_58.capTable._4_4_ = local_e8.capTable._4_4_;
        }
        local_58.nestingLimit = local_e8.nestingLimit;
        _::PointerReader::getStruct(&local_b8,&local_58,(word *)0x0);
        local_88.ptr = (byte *)(WirePointer *)0x0;
        local_88.elementCount = 0x7fffffff;
        if (local_b8.pointerCount != 0) {
          local_88.ptr = (byte *)local_b8.pointers;
          local_88.elementCount = local_b8.nestingLimit;
        }
        uVar2 = 0;
        uVar3 = 0;
        uVar4 = 0;
        uVar5 = 0;
        if (local_b8.pointerCount != 0) {
          uVar2 = local_b8.segment._0_4_;
          uVar3 = local_b8.segment._4_4_;
          uVar4 = local_b8.capTable._0_4_;
          uVar5 = local_b8.capTable._4_4_;
        }
        local_88.segment = (SegmentReader *)CONCAT44(uVar3,uVar2);
        local_88.capTable = (CapTableReader *)CONCAT44(uVar5,uVar4);
        goto LAB_0017aba7;
      }
      index = index + 1;
    } while (local_88.elementCount != index);
  }
  local_88.segment = proto._reader.segment;
  local_88.capTable = proto._reader.capTable;
  local_88.ptr = (byte *)proto._reader.pointers;
  local_88.elementCount = proto._reader.nestingLimit;
  if (proto._reader.pointerCount == 0) {
    local_88.elementCount = 0x7fffffff;
    local_88.capTable = (CapTableReader *)0x0;
    local_88.ptr = (byte *)0x0;
    local_88.segment = (SegmentReader *)0x0;
  }
LAB_0017aba7:
  AVar6 = (ArrayPtr<const_char>)
          _::PointerReader::getBlob<capnp::Text>((PointerReader *)&local_88,(void *)0x0,0);
  return (StringPtr)AVar6;
}

Assistant:

kj::StringPtr protoName(P proto) {
    KJ_IF_MAYBE(name, annotationValue(proto, NAME_ANNOTATION_ID)) {
      return name->getText();
    } else {
      return proto.getName();
    }
  }